

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void __thiscall
gl4cts::GLSL420Pack::ScalarSwizzlersInvalidTest::prepareShaderSource
          (ScalarSwizzlersInvalidTest *this,SHADER_STAGES in_stage,bool in_use_version_400,
          shaderSource *out_source)

{
  int iVar1;
  TestError *this_00;
  char *pcVar2;
  char *text;
  size_t position;
  
  if (in_stage < SHADER_STAGES_MAX) {
    if ((ulong)this->m_case < 7) {
      iVar1 = *(int *)(&DAT_016cbd3c + (ulong)this->m_case * 4);
      std::__cxx11::string::assign
                ((char *)(out_source->m_parts).
                         super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      position = 0;
      pcVar2 = "#version 420";
      if (in_use_version_400) {
        pcVar2 = 
        "#version 400\n#extension GL_ARB_shading_language_420pack : require\n#extension GL_ARB_separate_shader_objects : enable"
        ;
      }
      text = "#version 430";
      if (in_stage != COMPUTE_SHADER) {
        text = pcVar2;
      }
      Utils::replaceToken("VERSION",&position,text,
                          &((out_source->m_parts).
                            super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_code);
      Utils::replaceToken("UNIFORMS",&position,"uniform float variable;\n",
                          &((out_source->m_parts).
                            super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_code);
      Utils::replaceToken("VERIFICATION",&position,&DAT_016cbd3c + iVar1,
                          &((out_source->m_parts).
                            super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_code);
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x429e);
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x4282);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ScalarSwizzlersInvalidTest::prepareShaderSource(Utils::SHADER_STAGES in_stage, bool in_use_version_400,
													 Utils::shaderSource& out_source)
{
	static const GLchar* uniforms = "uniform float variable;\n";

	static const GLchar* verification_invalid_y = "\n"
												  "    if (0.125 != variable.y) )\n"
												  "    {\n"
												  "        result = vec4(1, 0, 0, 1);\n"
												  "    }\n";

	static const GLchar* verification_invalid_b = "\n"
												  "    if (0.125 != variable.b) )\n"
												  "    {\n"
												  "        result = vec4(1, 0, 0, 1);\n"
												  "    }\n";

	static const GLchar* verification_invalid_q = "\n"
												  "    if (0.125 != variable.q) )\n"
												  "    {\n"
												  "        result = vec4(1, 0, 0, 1);\n"
												  "    }\n";

	static const GLchar* verification_invalid_xy = "\n"
												   "    if (vec2(0.125, 0.25) != variable.xy) )\n"
												   "    {\n"
												   "        result = vec4(1, 0, 0, 1);\n"
												   "    }\n";

	static const GLchar* verification_invalid_xrs = "\n"
													"    if (vec3(0.125, 0.125, 0.25) != variable.xrs) )\n"
													"    {\n"
													"        result = vec4(1, 0, 0, 1);\n"
													"    }\n";

	static const GLchar* verification_wrong_u = "\n"
												"    if (0.125 != variable.u) )\n"
												"    {\n"
												"        result = vec4(1, 0, 0, 1);\n"
												"    }\n";

	static const GLchar* verification_missing_parenthesis = "\n"
															"    if (variable != 1.x) )\n"
															"    {\n"
															"        result = vec4(1, 0, 0, 1);\n"
															"    }\n";

	static const GLchar* compute_shader_template =
		"VERSION\n"
		"\n"
		"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		"\n"
		"writeonly uniform image2D uni_image;\n"
		"\n"
		"UNIFORMS"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"VERIFICATION"
		"\n"
		"    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), result);\n"
		"}\n"
		"\n";

	static const GLchar* fragment_shader_template = "VERSION\n"
													"\n"
													"#define FRAGMENT\n"
													"\n"
													"in  vec4 gs_fs_result;\n"
													"out vec4 fs_out_result;\n"
													"\n"
													"UNIFORMS"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != gs_fs_result)\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    fs_out_result = result;\n"
													"}\n"
													"\n";

	static const GLchar* geometry_shader_template = "VERSION\n"
													"\n"
													"layout(points)                           in;\n"
													"layout(triangle_strip, max_vertices = 4) out;\n"
													"\n"
													"in  vec4 tes_gs_result[];\n"
													"out vec4 gs_fs_result;\n"
													"\n"
													"UNIFORMS"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != tes_gs_result[0])\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    gs_fs_result  = result;\n"
													"    gl_Position   = vec4(-1, -1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result  = result;\n"
													"    gl_Position   = vec4(-1, 1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result  = result;\n"
													"    gl_Position   = vec4(1, -1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result  = result;\n"
													"    gl_Position   = vec4(1, 1, 0, 1);\n"
													"    EmitVertex();\n"
													"}\n"
													"\n";

	static const GLchar* tess_ctrl_shader_template =
		"VERSION\n"
		"\n"
		"layout(vertices = 1) out;\n"
		"\n"
		"in  vec4 vs_tcs_result[];\n"
		"out vec4 tcs_tes_result[];\n"
		"\n"
		"UNIFORMS"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"VERIFICATION"
		"    else if (vec4(0, 1, 0, 1) != vs_tcs_result[gl_InvocationID])\n"
		"    {\n"
		"         result = vec4(1, 0, 0, 1);\n"
		"    }\n"
		"\n"
		"    tcs_tes_result[gl_InvocationID] = result;\n"
		"\n"
		"    gl_TessLevelOuter[0] = 1.0;\n"
		"    gl_TessLevelOuter[1] = 1.0;\n"
		"    gl_TessLevelOuter[2] = 1.0;\n"
		"    gl_TessLevelOuter[3] = 1.0;\n"
		"    gl_TessLevelInner[0] = 1.0;\n"
		"    gl_TessLevelInner[1] = 1.0;\n"
		"}\n"
		"\n";

	static const GLchar* tess_eval_shader_template = "VERSION\n"
													 "\n"
													 "layout(isolines, point_mode) in;\n"
													 "\n"
													 "in  vec4 tcs_tes_result[];\n"
													 "out vec4 tes_gs_result;\n"
													 "\n"
													 "UNIFORMS"
													 "\n"
													 "void main()\n"
													 "{\n"
													 "    vec4 result = vec4(0, 1, 0, 1);\n"
													 "\n"
													 "VERIFICATION"
													 "    else if (vec4(0, 1, 0, 1) != tcs_tes_result[0])\n"
													 "    {\n"
													 "         result = vec4(1, 0, 0, 1);\n"
													 "    }\n"
													 "\n"
													 "    tes_gs_result = result;\n"
													 "}\n"
													 "\n";

	static const GLchar* vertex_shader_template = "VERSION\n"
												  "\n"
												  "out vec4 vs_tcs_result;\n"
												  "\n"
												  "UNIFORMS"
												  "\n"
												  "void main()\n"
												  "{\n"
												  "    vec4 result = vec4(0, 1, 0, 1);\n"
												  "\n"
												  "VERIFICATION"
												  "\n"
												  "    vs_tcs_result = result;\n"
												  "}\n"
												  "\n";

	const GLchar* shader_template	  = 0;
	const GLchar* verification_snippet = 0;

	switch (in_stage)
	{
	case Utils::COMPUTE_SHADER:
		shader_template = compute_shader_template;
		break;
	case Utils::FRAGMENT_SHADER:
		shader_template = fragment_shader_template;
		break;
	case Utils::GEOMETRY_SHADER:
		shader_template = geometry_shader_template;
		break;
	case Utils::TESS_CTRL_SHADER:
		shader_template = tess_ctrl_shader_template;
		break;
	case Utils::TESS_EVAL_SHADER:
		shader_template = tess_eval_shader_template;
		break;
	case Utils::VERTEX_SHADER:
		shader_template = vertex_shader_template;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	switch (m_case)
	{
	case INVALID_Y:
		verification_snippet = verification_invalid_y;
		break;
	case INVALID_B:
		verification_snippet = verification_invalid_b;
		break;
	case INVALID_Q:
		verification_snippet = verification_invalid_q;
		break;
	case INVALID_XY:
		verification_snippet = verification_invalid_xy;
		break;
	case INVALID_XRS:
		verification_snippet = verification_invalid_xrs;
		break;
	case WRONG:
		verification_snippet = verification_wrong_u;
		break;
	case MISSING_PARENTHESIS:
		verification_snippet = verification_missing_parenthesis;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	};

	out_source.m_parts[0].m_code = shader_template;

	size_t position = 0;
	Utils::replaceToken("VERSION", position, getVersionString(in_stage, in_use_version_400),
						out_source.m_parts[0].m_code);

	Utils::replaceToken("UNIFORMS", position, uniforms, out_source.m_parts[0].m_code);

	Utils::replaceToken("VERIFICATION", position, verification_snippet, out_source.m_parts[0].m_code);
}